

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparser.c
# Opt level: O0

int testPushCDataEnd(void)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int local_2c;
  int i;
  xmlParserCtxtPtr ctxt;
  xmlChar *chunk;
  xmlBufferPtr buf;
  int k;
  int err;
  
  buf._4_4_ = 0;
  for (buf._0_4_ = 0; (int)buf < 2; buf._0_4_ = (int)buf + 1) {
    lVar2 = xmlCreatePushParserCtxt(0,0,0,0);
    xmlCtxtSetOptions(lVar2,0x20);
    uVar3 = xmlBufferCreate();
    xmlBufferCCat(uVar3,"<doc>");
    if ((int)buf == 0) {
      xmlBufferCCat(uVar3,"x");
    }
    else {
      xmlBufferCCat(uVar3,anon_var_dwarf_479);
    }
    for (local_2c = 0; local_2c < 2000; local_2c = local_2c + 1) {
      xmlBufferCCat(uVar3,"x");
    }
    xmlBufferCCat(uVar3,"]");
    uVar4 = xmlBufferDetach(uVar3);
    xmlBufferFree(uVar3);
    uVar1 = xmlStrlen(uVar4);
    xmlParseChunk(lVar2,uVar4,uVar1,0);
    xmlParseChunk(lVar2,"]>xxx</doc>",0xb);
    if (*(int *)(lVar2 + 0x88) != 0x3e) {
      fprintf(_stderr,"xmlParseChunk failed to detect CData end: %d\n",
              (ulong)*(uint *)(lVar2 + 0x88));
      buf._4_4_ = 1;
    }
    (*_xmlFree)(uVar4);
    xmlFreeDoc(*(undefined8 *)(lVar2 + 0x10));
    xmlFreeParserCtxt(lVar2);
  }
  return buf._4_4_;
}

Assistant:

static int
testPushCDataEnd(void) {
    int err = 0;
    int k;

    for (k = 0; k < 2; k++) {
        xmlBufferPtr buf;
        xmlChar *chunk;
        xmlParserCtxtPtr ctxt;
        int i;

        ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0, NULL);
        xmlCtxtSetOptions(ctxt, XML_PARSE_NOERROR);

        /*
         * Push parse text data with ']]>' split across chunks.
         */
        buf = xmlBufferCreate();
        xmlBufferCCat(buf, "<doc>");

        /*
         * Also test xmlParseCharDataCopmlex
         */
        if (k == 0)
            xmlBufferCCat(buf, "x");
        else
            xmlBufferCCat(buf, "\xC3\xA4");

        /*
         * Create enough data to trigger a "characters" SAX callback.
         * (XML_PARSER_BIG_BUFFER_SIZE = 300)
         */
        for (i = 0; i < 2000; i++)
            xmlBufferCCat(buf, "x");

        xmlBufferCCat(buf, "]");
        chunk = xmlBufferDetach(buf);
        xmlBufferFree(buf);

        xmlParseChunk(ctxt, (char *) chunk, xmlStrlen(chunk), 0);
        xmlParseChunk(ctxt, "]>xxx</doc>", 11, 1);

        if (ctxt->errNo != XML_ERR_MISPLACED_CDATA_END) {
            fprintf(stderr, "xmlParseChunk failed to detect CData end: %d\n",
                    ctxt->errNo);
            err = 1;
        }

        xmlFree(chunk);
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
    }

    return err;
}